

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddLanguageFlagsForLinking
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang,
          string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = this->Makefile;
  std::operator+(&local_50,"CMAKE_",lang);
  std::operator+(&local_70,&local_50,"_LINK_WITH_STANDARD_COMPILE_OPTION");
  bVar1 = cmMakefile::IsOn(this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (bVar1) {
    AddCompilerRequirementFlag(this,flags,target,lang);
  }
  AddLanguageFlags(this,flags,target,lang,config);
  bVar1 = cmGeneratorTarget::IsIPOEnabled(target,lang,config);
  if (bVar1) {
    AppendFeatureOptions(this,flags,lang,"IPO");
  }
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlagsForLinking(
  std::string& flags, cmGeneratorTarget const* target, const std::string& lang,
  const std::string& config)
{
  if (this->Makefile->IsOn("CMAKE_" + lang +
                           "_LINK_WITH_STANDARD_COMPILE_OPTION")) {
    // This toolchain requires use of the language standard flag
    // when linking in order to use the matching standard library.
    // FIXME: If CMake gains an abstraction for standard library
    // selection, this will have to be reconciled with it.
    this->AddCompilerRequirementFlag(flags, target, lang);
  }

  this->AddLanguageFlags(flags, target, lang, config);

  if (target->IsIPOEnabled(lang, config)) {
    this->AppendFeatureOptions(flags, lang, "IPO");
  }
}